

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O2

uint8_t MatchExact(Size size)

{
  ulong uVar1;
  
  uVar1 = 0x18;
  if (0x18 < size) {
    uVar1 = size;
  }
  if ((uVar1 & 7) == 0) {
    if (uVar1 - 0x18 < 0x200) {
      return (uint8_t)(uVar1 - 0x18 >> 3);
    }
    __assert_fail("((size - sizeof(Chuck)) >> 3u) < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                  ,0xc0,"uint8_t MatchExact(Size)");
  }
  __assert_fail("!(size & 0x07u)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0xbe,"uint8_t MatchExact(Size)");
}

Assistant:

static uint8_t MatchExact(Size size) {
    if (size < sizeof(Chuck)) {
        size = sizeof(Chuck);
    }
    assert(!(size & 0x07u));
    // size in [24, 536)
    assert(((size - sizeof(Chuck)) >> 3u) < 64);
    return (size - sizeof(Chuck)) >> 3u;
}